

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_file_block_manager.cpp
# Opt level: O3

unique_ptr<duckdb::Block,_std::default_delete<duckdb::Block>,_true> __thiscall
duckdb::SingleFileBlockManager::CreateBlock
          (SingleFileBlockManager *this,block_id_t block_id,FileBuffer *source_buffer)

{
  Allocator *allocator;
  Block *this_00;
  pointer this_01;
  long in_RCX;
  _func_int **local_30;
  
  if (in_RCX == 0) {
    allocator = Allocator::Get(*(AttachedDatabase **)(block_id + 0x88));
    this_00 = (Block *)operator_new(0x40);
    Block::Block(this_00,allocator,(block_id_t)source_buffer,(BlockManager *)block_id);
    (this->super_BlockManager)._vptr_BlockManager = (_func_int **)this_00;
  }
  else {
    (**(code **)(*(long *)block_id + 0x10))(&local_30,block_id,source_buffer);
    (this->super_BlockManager)._vptr_BlockManager = local_30;
  }
  this_01 = unique_ptr<duckdb::Block,_std::default_delete<duckdb::Block>,_true>::operator->
                      ((unique_ptr<duckdb::Block,_std::default_delete<duckdb::Block>,_true> *)this);
  FileBuffer::Initialize(&this_01->super_FileBuffer,*(DebugInitialize *)(block_id + 0x1ea));
  return (unique_ptr<duckdb::Block,_std::default_delete<duckdb::Block>_>)
         (unique_ptr<duckdb::Block,_std::default_delete<duckdb::Block>_>)this;
}

Assistant:

unique_ptr<Block> SingleFileBlockManager::CreateBlock(block_id_t block_id, FileBuffer *source_buffer) {
	unique_ptr<Block> result;
	if (source_buffer) {
		result = ConvertBlock(block_id, *source_buffer);
	} else {
		result = make_uniq<Block>(Allocator::Get(db), block_id, *this);
	}
	result->Initialize(options.debug_initialize);
	return result;
}